

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

RenderableBatch * __thiscall nite::Batch::draw(Batch *this,float x,float y)

{
  float *pfVar1;
  float fVar2;
  RenderableBatch *this_00;
  Color *pCVar3;
  Vec2 local_44 [2];
  RenderableBatch *local_30;
  RenderableBatch *obj;
  float rh;
  float rw;
  float y_local;
  float x_local;
  Batch *this_local;
  
  if ((uint)this->objectId < 0x80000000) {
    obj._4_4_ = (this->size).x;
    obj._0_4_ = (this->size).y;
    fVar2 = (this->region).w;
    if ((((fVar2 != (this->size).x) || (NAN(fVar2) || NAN((this->size).x))) ||
        (fVar2 = (this->region).h, pfVar1 = &(this->size).y, fVar2 != *pfVar1)) ||
       (NAN(fVar2) || NAN(*pfVar1))) {
      obj._4_4_ = (this->region).w;
      obj._0_4_ = (this->region).h;
    }
    rh = y;
    rw = x;
    _y_local = this;
    this_00 = (RenderableBatch *)operator_new(0x90);
    *(undefined8 *)&(this_00->scale).y = 0;
    this_00->orig = (Batch *)0x0;
    this_00->objectId = 0;
    this_00->angle = 0.0;
    this_00->smooth = false;
    *(undefined3 *)&this_00->field_0x79 = 0;
    (this_00->scale).x = 0.0;
    (this_00->region).x = 0.0;
    (this_00->region).y = 0.0;
    (this_00->region).w = 0.0;
    (this_00->region).h = 0.0;
    (this_00->size).x = 0.0;
    (this_00->size).y = 0.0;
    (this_00->origin).x = 0.0;
    (this_00->origin).y = 0.0;
    (this_00->super_Renderable).target = 0;
    (this_00->super_Renderable).depth = 0;
    (this_00->origSize).x = 0.0;
    (this_00->origSize).y = 0.0;
    (this_00->super_Renderable).programs.
    super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super_Renderable).programs.
    super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->super_Renderable).function = (RenderFunction)0x0;
    (this_00->super_Renderable).programs.
    super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super_Renderable).color.b = 0.0;
    (this_00->super_Renderable).color.a = 0.0;
    (this_00->super_Renderable).position.x = 0.0;
    (this_00->super_Renderable).position.y = 0.0;
    (this_00->super_Renderable)._vptr_Renderable = (_func_int **)0x0;
    (this_00->super_Renderable).color.r = 0.0;
    (this_00->super_Renderable).color.g = 0.0;
    RenderableBatch::RenderableBatch(this_00);
    this_00->objectId = this->objectId;
    this_00->origSize = this->size;
    this_00->orig = this;
    (this_00->size).x = obj._4_4_;
    (this_00->size).y = obj._0_4_;
    (this_00->super_Renderable).position.x = rw;
    (this_00->super_Renderable).position.y = rh;
    this_00->angle = 0.0;
    this_00->smooth = (bool)(this->smooth & 1);
    local_30 = this_00;
    Vec2::Vec2(local_44,0.0,0.0);
    local_30->origin = local_44[0];
    (local_30->super_Renderable).function = drawBatch;
    pCVar3 = getColor();
    fVar2 = pCVar3->g;
    (local_30->super_Renderable).color.r = pCVar3->r;
    (local_30->super_Renderable).color.g = fVar2;
    fVar2 = pCVar3->a;
    (local_30->super_Renderable).color.b = pCVar3->b;
    (local_30->super_Renderable).color.a = fVar2;
    fVar2 = (this->region).y;
    (local_30->region).x = (this->region).x;
    (local_30->region).y = fVar2;
    fVar2 = (this->region).h;
    (local_30->region).w = (this->region).w;
    (local_30->region).h = fVar2;
    local_30->scale = this->scale;
    addRenderList(&local_30->super_Renderable);
    this_local = (Batch *)local_30;
  }
  else {
    this_local = (Batch *)0x0;
  }
  return (RenderableBatch *)this_local;
}

Assistant:

RenderableBatch *nite::Batch::draw(float x, float y){
	if(objectId <= -1) return NULL;
	float rw = size.x;
	float rh = size.y;
	if(region.w != size.x || region.h != size.y){
		rw = region.w;
		rh = region.h;
	}
	nite::RenderableBatch *obj = new nite::RenderableBatch();
	obj->objectId = objectId;
	obj->origSize = size;
	obj->orig = this;
	obj->size.x	= rw;
	obj->size.y = rh;
	obj->position.x = x;
	obj->position.y = y;
	obj->angle = 0;
	obj->smooth	= smooth;
	obj->origin	= nite::Vec2(0, 0);
	obj->function	= &drawBatch;
	obj->color = nite::getColor();
	obj->region	= region;
	obj->scale = scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}